

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O0

void __thiscall MeCab::CharProperty::CharProperty(CharProperty *this)

{
  undefined1 *this_00;
  Mmap<char> *this_01;
  whatlog *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__CharProperty_001c6748;
  this_00 = &in_RDI->field_0x8;
  this_01 = (Mmap<char> *)operator_new(0x1d8);
  Mmap<char>::Mmap(this_01);
  scoped_ptr<MeCab::Mmap<char>_>::scoped_ptr((scoped_ptr<MeCab::Mmap<char>_> *)this_00,this_01);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x131ea7);
  *(undefined8 *)&in_RDI->field_0x30 = 0;
  *(undefined4 *)&in_RDI->field_0x38 = 0;
  whatlog::whatlog(in_RDI);
  return;
}

Assistant:

CharProperty(): cmmap_(new Mmap<char>), map_(0), charset_(0) {}